

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::inv_GammaP<long_double>(longdouble a,longdouble p)

{
  int iVar1;
  longdouble *plVar2;
  longdouble *extraout_RAX;
  longdouble *plVar3;
  undefined4 extraout_var;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST5;
  double __x;
  double __x_00;
  double dVar10;
  double __x_01;
  double __x_02;
  double __x_03;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  longdouble u;
  longdouble t_2;
  longdouble err;
  int i;
  longdouble t_1;
  longdouble t;
  longdouble pp;
  longdouble x;
  longdouble afac;
  longdouble lna1;
  longdouble glna;
  longdouble a1;
  longdouble eps;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffdf2;
  undefined2 in_stack_fffffffffffffdf8;
  undefined2 uVar12;
  undefined6 in_stack_fffffffffffffe02;
  undefined2 in_stack_fffffffffffffe08;
  undefined6 uStack_1f6;
  undefined2 in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe12;
  undefined6 in_stack_fffffffffffffe14;
  undefined4 uStack_1e6;
  longdouble local_18c;
  longdouble local_15c;
  longdouble local_150;
  longdouble local_138;
  longdouble local_128;
  longdouble local_118;
  longdouble local_108;
  longdouble local_f8;
  uint local_dc;
  longdouble local_d8;
  longdouble local_c8;
  longdouble local_b8 [2];
  longdouble local_98;
  longdouble local_88;
  longdouble local_78;
  longdouble local_48;
  longdouble local_38;
  longdouble local_28;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_28 = in_stack_00000018;
  local_15c = in_ST5;
  std::numeric_limits<long_double>::epsilon();
  std::sqrt(__x);
  local_48 = local_18 - (longdouble)1;
  lVar5 = local_15c;
  local_38 = in_ST1;
  ln_Gamma((longdouble)
           CONCAT28(in_stack_fffffffffffffdf8,
                    CONCAT62(in_stack_fffffffffffffdf2,(short)((unkuint10)local_18 >> 0x40))));
  ln((longdouble)
     CONCAT28(in_stack_fffffffffffffdf8,
              CONCAT62(in_stack_fffffffffffffdf2,(short)((unkuint10)local_48 >> 0x40))));
  lVar6 = lVar5;
  lVar7 = lVar5;
  dVar10 = std::exp(__x_00);
  local_78 = in_ST4;
  if (local_18 <= (longdouble)1) {
    local_d8 = (longdouble)1 - ((longdouble)0.253 + (longdouble)0.12 * local_18) * local_18;
    if (local_d8 <= local_28) {
      lVar6 = lVar5;
      lVar7 = lVar5;
      lVar8 = lVar5;
      plVar2 = ln1p((longdouble)
                    CONCAT28(in_stack_fffffffffffffdf8,
                             CONCAT62(in_stack_fffffffffffffdf2,
                                      (short)((unkuint10)
                                              (-(local_28 - local_d8) / ((longdouble)1 - local_d8))
                                             >> 0x40))));
      local_18c = (longdouble)1 - in_ST5;
    }
    else {
      lVar7 = lVar6;
      lVar8 = lVar6;
      std::pow(dVar10,in_XMM1_Qa);
      plVar2 = extraout_RAX;
      local_18c = in_ST5;
    }
    local_88 = local_18c;
  }
  else {
    if ((longdouble)0.5 <= local_28) {
      local_150 = (longdouble)1 - local_28;
    }
    else {
      local_150 = local_28;
    }
    local_98 = local_150;
    lVar4 = lVar5;
    lVar5 = lVar7;
    ln((longdouble)
       CONCAT28(in_stack_fffffffffffffdf8,
                CONCAT62(in_stack_fffffffffffffdf2,(short)((unkuint10)local_150 >> 0x40))));
    dVar10 = std::sqrt(__x_01);
    local_c8 = local_18;
    local_15c = ((longdouble)2.30753 + (longdouble)0.27061 * local_15c) /
                ((longdouble)1 + ((longdouble)0.99229 + (longdouble)0.04481 * local_15c) * local_15c
                ) - local_15c;
    if (local_28 < (longdouble)0.5) {
      local_15c = -local_15c;
    }
    local_88 = local_15c;
    local_b8[0] = _DAT_00468450;
    local_15c = lVar6;
    dVar10 = std::sqrt(dVar10);
    lVar6 = lVar5;
    lVar7 = lVar5;
    lVar8 = lVar5;
    std::pow(dVar10,in_XMM1_Qa);
    local_c8 = local_c8 * lVar4;
    plVar2 = utility::max<long_double>(local_b8,&local_c8);
    local_88 = *plVar2;
  }
  local_dc = 0;
  while( true ) {
    if ((0x3f < (int)local_dc) || (local_88 <= (longdouble)0)) {
      return plVar2;
    }
    uVar12 = SUB102(local_88,0);
    lVar9 = lVar8;
    GammaP<long_double,true>
              ((longdouble)
               CONCAT64(in_stack_fffffffffffffe14,
                        CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10)),
               (longdouble)
               CONCAT28(in_stack_fffffffffffffe08,
                        CONCAT62(in_stack_fffffffffffffe02,(short)((unkuint10)local_88 >> 0x40))));
    lVar4 = local_78;
    local_f8 = local_15c - local_28;
    uVar11 = (undefined2)((unkuint10)local_88 >> 0x40);
    local_15c = lVar7;
    if (local_18 <= (longdouble)1) {
      ln((longdouble)CONCAT28(uVar12,CONCAT62(in_stack_fffffffffffffdf2,uVar11)));
      std::exp(__x_03);
      local_108 = lVar5;
    }
    else {
      ln((longdouble)CONCAT28(uVar12,CONCAT62(in_stack_fffffffffffffdf2,uVar11)));
      std::exp(__x_02);
      lVar9 = lVar8;
      local_108 = lVar4 * lVar5;
    }
    lVar5 = lVar9;
    lVar7 = local_f8 / local_108;
    local_128 = (longdouble)1;
    in_stack_fffffffffffffe14 = SUB106(local_128,0);
    uStack_1e6 = (undefined4)((unkuint10)local_128 >> 0x30);
    local_138 = lVar7 * ((local_18 - local_128) / local_88 - local_128);
    plVar2 = &local_128;
    local_118 = lVar7;
    plVar3 = utility::min<long_double>(plVar2,&local_138);
    local_108 = lVar7 / ((longdouble)-0.5 * *plVar3 +
                        (longdouble)CONCAT46(uStack_1e6,in_stack_fffffffffffffe14));
    local_88 = local_88 - local_108;
    if ((longdouble)0 < local_88) {
      in_stack_fffffffffffffe08 = SUB102(local_88,0);
      uStack_1f6 = (undefined6)((unkuint10)local_88 >> 0x10);
      in_stack_fffffffffffffe10 = (undefined2)((unkuint10)local_88 >> 0x40);
    }
    else {
      lVar7 = (longdouble)0.5 * (local_108 + local_88);
      in_stack_fffffffffffffe08 = SUB102(lVar7,0);
      uStack_1f6 = (undefined6)((unkuint10)lVar7 >> 0x10);
      in_stack_fffffffffffffe10 = (undefined2)((unkuint10)lVar7 >> 0x40);
    }
    local_88 = (longdouble)
               CONCAT28(in_stack_fffffffffffffe10,CONCAT62(uStack_1f6,in_stack_fffffffffffffe08));
    lVar8 = lVar5;
    lVar7 = lVar5;
    iVar1 = std::abs((int)plVar2);
    if (lVar6 < local_88 * local_38) break;
    local_dc = local_dc + 1;
    plVar2 = (longdouble *)(ulong)local_dc;
    lVar6 = lVar8;
    lVar8 = lVar7;
  }
  return (longdouble *)CONCAT44(extraout_var,iVar1);
}

Assistant:

TRNG_CUDA_ENABLE T inv_GammaP(T a, T p) {
        const T eps{sqrt(numeric_limits<T>::epsilon())};
        const T a1{a - 1};
        const T glna{ln_Gamma(a)};
        const T lna1{ln(a1)};
        const T afac{exp(a1 * (lna1 - 1) - glna)};
        T x;
        // initial guess
        if (a > T{1}) {
          const T pp{p < T{1} / T{2} ? p : 1 - p};
          const T t{sqrt(-2 * ln(pp))};
          x = (T{2.30753} + t * T{0.27061}) / (1 + t * (T{0.99229} + t * T{0.04481})) - t;
          x = p < T{1} / T{2} ? -x : x;
          x = utility::max(T{1} / T{1000}, a * pow(1 - 1 / (9 * a) - x / (3 * sqrt(a)), T{3}));
        } else {
          const T t{1 - a * (T{0.253} + a * T{0.12})};
          x = p < t ? pow(p / t, 1 / a) : 1 - ln1p(-(p - t) / (1 - t));
        }
        // refinement by Halley's method
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          if (x <= 0) {
            x = 0;
            break;
          }
          const T err{GammaP<T, true>(a, x) - p};
          T t;
          if (a > 1)
            t = afac * exp(-(x - a1) + a1 * (ln(x) - lna1));
          else
            t = exp(-x + a1 * ln(x) - glna);
          const T u{err / t};
          t = u / (1 - utility::min(T{1}, u * ((a - 1) / x - 1)) / 2);
          x -= t;
          x = x <= 0 ? (x + t) / 2 : x;
          if (abs(t) < eps * x)
            break;
        }
        return x;
      }